

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SchemaValidator::preContentValidation
          (SchemaValidator *this,bool param_1,bool validateDefAttr)

{
  GrammarResolver *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  CreateReasons CVar5;
  AttTypes AVar6;
  uint baseScope;
  MemoryManager *pMVar7;
  SchemaElementDecl *this_01;
  XMLCh *pXVar8;
  long *plVar9;
  XMLAttDef *pXVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLScanner *pXVar11;
  ComplexTypeInfo *this_02;
  XMLStringPool *pStringPool;
  XercesGroupInfo *this_03;
  XercesGroupInfo *this_04;
  ContentSpecNode *curNode;
  ContentSpecNode *baseNode;
  bool bVar12;
  XMLException *excep;
  XercesGroupInfo *baseGroup;
  XercesGroupInfo *curGroup;
  RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> groupEnum;
  RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *groupInfoRegistry;
  ComplexTypeInfo *curTypeInfo;
  RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> complexTypeEnum;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *complexTypeRegistry;
  XMLCh *lastPtr;
  XMLCh *listPtr;
  undefined1 local_e8 [7];
  bool breakFlag;
  ArrayJanitor<char16_t> janList;
  XMLCh *list;
  XMLAttDef *curAttDef;
  XMLSize_t i;
  bool seenId;
  XMLAttDefList *attDefList;
  CreateReasons reason;
  SchemaElementDecl *curElem;
  RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> elemEnum;
  SchemaGrammar *sGrammar;
  Grammar *grammar;
  undefined1 local_48 [8];
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  bool validateDefAttr_local;
  bool param_1_local;
  SchemaValidator *this_local;
  undefined4 extraout_var;
  
  grammarEnum.fMemoryManager._6_1_ = validateDefAttr;
  grammarEnum.fMemoryManager._7_1_ = param_1;
  GrammarResolver::getGrammarEnumerator
            ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)local_48,
             this->fGrammarResolver);
  do {
    do {
      bVar2 = RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
              hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>
                               *)local_48);
      if (!bVar2) {
        RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
        ~RefHashTableOfEnumerator
                  ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                   local_48);
        return;
      }
      pMVar7 = (MemoryManager *)
               RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
               nextElement((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>
                            *)local_48);
      iVar3 = (*((XSerializable *)&pMVar7->_vptr_MemoryManager)->_vptr_XSerializable[5])();
    } while ((iVar3 != 1) ||
            (uVar4 = (*((XSerializable *)&pMVar7->_vptr_MemoryManager)->_vptr_XSerializable[7])(),
            (uVar4 & 1) != 0));
    elemEnum.fMemoryManager = pMVar7;
    (*((XSerializable *)&pMVar7->_vptr_MemoryManager)->_vptr_XSerializable[0x13])(pMVar7,1);
    SchemaGrammar::getElemEnumerator
              ((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                *)&curElem,(SchemaGrammar *)elemEnum.fMemoryManager);
LAB_0041a1cb:
    bVar2 = RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
            ::hasMoreElements((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                               *)&curElem);
    if (bVar2) {
      this_01 = RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                ::nextElement((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                               *)&curElem);
      CVar5 = XMLElementDecl::getCreateReason(&this_01->super_XMLElementDecl);
      if (CVar5 != Declared) {
        if (CVar5 == AttList) {
          pXVar11 = XMLValidator::getScanner(&this->super_XMLValidator);
          pXVar8 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
          XMLScanner::emitError
                    (pXVar11,UndeclaredElemInAttList,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        else if (CVar5 == AsRootElem) {
          pXVar8 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
          XMLValidator::emitError
                    (&this->super_XMLValidator,UndeclaredElemInDocType,pXVar8,(XMLCh *)0x0,
                     (XMLCh *)0x0,(XMLCh *)0x0);
        }
        else if (CVar5 == InContentModel) {
          pXVar11 = XMLValidator::getScanner(&this->super_XMLValidator);
          pXVar8 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
          XMLScanner::emitError
                    (pXVar11,UndeclaredElemInCM,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      uVar4 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])();
      if ((uVar4 & 1) != 0) {
        iVar3 = (*(this_01->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[5])();
        plVar9 = (long *)CONCAT44(extraout_var,iVar3);
        bVar2 = false;
        for (curAttDef = (XMLAttDef *)0x0; pXVar10 = (XMLAttDef *)(**(code **)(*plVar9 + 0x50))(),
            curAttDef < pXVar10;
            curAttDef = (XMLAttDef *)
                        ((long)&(curAttDef->super_XSerializable)._vptr_XSerializable + 1)) {
          pXVar10 = (XMLAttDef *)(**(code **)(*plVar9 + 0x58))(plVar9,curAttDef);
          AVar6 = XMLAttDef::getType(pXVar10);
          if (AVar6 == ID) {
            if (bVar2) {
              pXVar8 = XMLElementDecl::getFullName(&this_01->super_XMLElementDecl);
              XMLValidator::emitError
                        (&this->super_XMLValidator,MultipleIdAttrs,pXVar8,(XMLCh *)0x0,(XMLCh *)0x0,
                         (XMLCh *)0x0);
              break;
            }
            bVar2 = true;
          }
          else {
            AVar6 = XMLAttDef::getType(pXVar10);
            if ((AVar6 == Notation) &&
               (pXVar8 = XMLAttDef::getEnumeration(pXVar10), pXVar8 != (XMLCh *)0x0)) {
              pXVar8 = XMLAttDef::getEnumeration(pXVar10);
              janList.fMemoryManager =
                   (MemoryManager *)XMLString::replicate(pXVar8,this->fMemoryManager);
              ArrayJanitor<char16_t>::ArrayJanitor
                        ((ArrayJanitor<char16_t> *)local_e8,(char16_t *)janList.fMemoryManager,
                         this->fMemoryManager);
              bVar1 = false;
              lastPtr = (XMLCh *)janList.fMemoryManager;
              pMVar7 = janList.fMemoryManager;
              while( true ) {
                while( true ) {
                  bVar12 = false;
                  if (*lastPtr != L'\0') {
                    bVar12 = *lastPtr != L' ';
                  }
                  if (!bVar12) break;
                  lastPtr = lastPtr + 1;
                }
                if (*lastPtr == L'\0') {
                  bVar1 = true;
                }
                else {
                  *lastPtr = L'\0';
                }
                iVar3 = (*(elemEnum.fMemoryManager)->_vptr_MemoryManager[0xf])
                                  (elemEnum.fMemoryManager,pMVar7);
                if (CONCAT44(extraout_var_00,iVar3) == 0) {
                  iVar3 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[5])();
                  XMLValidator::emitError
                            (&this->super_XMLValidator,UnknownNotRefAttr,
                             (XMLCh *)CONCAT44(extraout_var_01,iVar3),(XMLCh *)pMVar7,(XMLCh *)0x0,
                             (XMLCh *)0x0);
                }
                if (bVar1) break;
                lastPtr = lastPtr + 1;
                pMVar7 = (MemoryManager *)lastPtr;
              }
              ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_e8);
            }
          }
          if (((grammarEnum.fMemoryManager._6_1_ & 1) != 0) &&
             (pXVar8 = XMLAttDef::getValue(pXVar10), pXVar8 != (XMLCh *)0x0)) {
            pXVar8 = XMLAttDef::getValue(pXVar10);
            (*(this->super_XMLValidator)._vptr_XMLValidator[8])(this,pXVar10,pXVar8,1,this_01);
          }
        }
      }
      goto LAB_0041a1cb;
    }
    pXVar11 = XMLValidator::getScanner(&this->super_XMLValidator);
    bVar2 = XMLScanner::getValidationSchemaFullChecking(pXVar11);
    if (bVar2) {
      complexTypeEnum.fMemoryManager =
           (MemoryManager *)
           SchemaGrammar::getComplexTypeRegistry((SchemaGrammar *)elemEnum.fMemoryManager);
      RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
      RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                  *)&curTypeInfo,
                 (RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *)
                 complexTypeEnum.fMemoryManager,false,this->fMemoryManager);
      while (bVar2 = RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                     ::hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                                        *)&curTypeInfo), bVar2) {
        this_02 = RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                  ::nextElement((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                                 *)&curTypeInfo);
        pMVar7 = elemEnum.fMemoryManager;
        this_00 = this->fGrammarResolver;
        pStringPool = GrammarResolver::getStringPool(this_00);
        ComplexTypeInfo::checkUniqueParticleAttribution
                  (this_02,(SchemaGrammar *)pMVar7,this_00,pStringPool,&this->super_XMLValidator);
        checkParticleDerivation(this,(SchemaGrammar *)elemEnum.fMemoryManager,this_02);
        checkRefElementConsistency
                  (this,(SchemaGrammar *)elemEnum.fMemoryManager,this_02,(XercesGroupInfo *)0x0);
      }
      groupEnum.fMemoryManager =
           (MemoryManager *)
           SchemaGrammar::getGroupInfoRegistry((SchemaGrammar *)elemEnum.fMemoryManager);
      RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
      RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                  *)&curGroup,
                 (RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *)
                 groupEnum.fMemoryManager,false,this->fMemoryManager);
      while (bVar2 = RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                     ::hasMoreElements((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                                        *)&curGroup), bVar2) {
        this_03 = RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                  ::nextElement((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                                 *)&curGroup);
        this_04 = XercesGroupInfo::getBaseGroup(this_03);
        pMVar7 = elemEnum.fMemoryManager;
        if (this_04 != (XercesGroupInfo *)0x0) {
          curNode = XercesGroupInfo::getContentSpec(this_03);
          uVar4 = XercesGroupInfo::getScope(this_03);
          baseNode = XercesGroupInfo::getContentSpec(this_04);
          baseScope = XercesGroupInfo::getScope(this_04);
          checkParticleDerivationOk
                    (this,(SchemaGrammar *)pMVar7,curNode,uVar4,baseNode,baseScope,
                     (ComplexTypeInfo *)0x0,true);
        }
        bVar2 = XercesGroupInfo::getCheckElementConsistency(this_03);
        if (bVar2) {
          checkRefElementConsistency
                    (this,(SchemaGrammar *)elemEnum.fMemoryManager,(ComplexTypeInfo *)0x0,this_03);
        }
      }
      RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher>
                  *)&curGroup);
      RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator
                ((RefHashTableOfEnumerator<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher>
                  *)&curTypeInfo);
    }
    RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
    ~RefHash3KeysIdPoolEnumerator
              ((RefHash3KeysIdPoolEnumerator<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                *)&curElem);
  } while( true );
}

Assistant:

void SchemaValidator::preContentValidation(bool,
                                           bool validateDefAttr)
{
    //  Lets go through all the grammar in the GrammarResolver
    //    and validate those that has not been validated yet
    //
    //  Lets enumerate all of the elements in the element decl pool
    //    and put out an error for any that did not get declared.
    //    We also check all of the attributes as well.
    //
    //  And enumerate all the complextype info in the grammar
    //    and do Unique Particle Attribution Checking

    RefHashTableOfEnumerator<Grammar> grammarEnum = fGrammarResolver->getGrammarEnumerator();
    while (grammarEnum.hasMoreElements())
    {
        Grammar& grammar = grammarEnum.nextElement();
        if (grammar.getGrammarType() != Grammar::SchemaGrammarType || grammar.getValidated())
             continue;
        SchemaGrammar& sGrammar = (SchemaGrammar&) grammar;
        sGrammar.setValidated(true);

        RefHash3KeysIdPoolEnumerator<SchemaElementDecl> elemEnum = sGrammar.getElemEnumerator();

        while (elemEnum.hasMoreElements())
        {
            SchemaElementDecl& curElem = elemEnum.nextElement();

            //  First check if declared or not
            //
            //  See if this element decl was ever marked as declared. If
            //  not, then put out an error. In some cases its just
            //  a warning, such as being referenced in a content model.
            //
            const SchemaElementDecl::CreateReasons reason = curElem.getCreateReason();

            if (reason != XMLElementDecl::Declared)
            {
                if (reason == XMLElementDecl::AttList)
                {
                    getScanner()->emitError
                    (
                        XMLErrs::UndeclaredElemInAttList
                        , curElem.getFullName()
                    );
                }
                 else if (reason == XMLElementDecl::AsRootElem)
                {
                    emitError
                    (
                        XMLValid::UndeclaredElemInDocType
                        , curElem.getFullName()
                    );
                }
                 else if (reason == XMLElementDecl::InContentModel)
                {
                    getScanner()->emitError
                    (
                        XMLErrs::UndeclaredElemInCM
                        , curElem.getFullName()
                    );
                }
                else
                {
                }
            }

            //
            //  Then check all of the attributes of the current element.
            //  We check for:
            //
            //  1) Multiple ID attributes
            //  2) That all of the default values of attributes are
            //      valid for their type.
            //  3) That for any notation types, that their lists
            //      of possible values refer to declared notations.
            //
            if (curElem.hasAttDefs()) {
                XMLAttDefList& attDefList = curElem.getAttDefList();
                bool seenId = false;

                for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
                {
                    const XMLAttDef& curAttDef = attDefList.getAttDef(i);

                    if (curAttDef.getType() == XMLAttDef::ID)
                    {
                        if (seenId)
                        {
                            emitError
                            (
                                XMLValid::MultipleIdAttrs
                                , curElem.getFullName()
                            );
                            break;
                        }

                        seenId = true;
                    }
                     else if (curAttDef.getType() == XMLAttDef::Notation && curAttDef.getEnumeration())
                    {
                        //
                        //  We need to verify that all of its possible values
                        //  (in the enum list) refer to valid notations.
                        //
                        XMLCh* list = XMLString::replicate(curAttDef.getEnumeration(), fMemoryManager);
                        ArrayJanitor<XMLCh> janList(list, fMemoryManager);

                        //
                        //  Search forward for a space or a null. If a null,
                        //  we are done. If a space, cap it and look it up.
                        //
                        bool    breakFlag = false;
                        XMLCh*  listPtr = list;
                        XMLCh*  lastPtr = listPtr;
                        while (true)
                        {
                            while (*listPtr && (*listPtr != chSpace))
                                listPtr++;

                            //
                            //  If at the end, indicate we need to break after
                            //  this one. Else, cap it off here.
                            //
                            if (!*listPtr)
                                breakFlag = true;
                            else
                                *listPtr = chNull;

                            if (!sGrammar.getNotationDecl(lastPtr))
                            {
                                emitError
                                (
                                    XMLValid::UnknownNotRefAttr
                                    , curAttDef.getFullName()
                                    , lastPtr
                                );
                            }

                            // Break out if we hit the end last time
                            if (breakFlag)
                                break;

                            // Else move upwards and try again
                            listPtr++;
                            lastPtr = listPtr;
                        }
                    }

                    // If it has a default/fixed value, then validate it
                    if (validateDefAttr && curAttDef.getValue())
                    {
                        validateAttrValue
                        (
                            &curAttDef
                            , curAttDef.getValue()
                            , true
                            , &curElem
                        );
                    }
                }
            }
        }

        //  For each complex type info, check the Unique Particle Attribution
        if (getScanner()->getValidationSchemaFullChecking()) {
            RefHashTableOf<ComplexTypeInfo>* complexTypeRegistry = sGrammar.getComplexTypeRegistry();

            RefHashTableOfEnumerator<ComplexTypeInfo> complexTypeEnum(complexTypeRegistry, false, fMemoryManager);
            while (complexTypeEnum.hasMoreElements())
            {
                ComplexTypeInfo& curTypeInfo = complexTypeEnum.nextElement();
                curTypeInfo.checkUniqueParticleAttribution(&sGrammar, fGrammarResolver, fGrammarResolver->getStringPool(), this);
                checkParticleDerivation(&sGrammar, &curTypeInfo);
                checkRefElementConsistency(&sGrammar, &curTypeInfo);
            }

            RefHashTableOf<XercesGroupInfo>* groupInfoRegistry = sGrammar.getGroupInfoRegistry();
            RefHashTableOfEnumerator<XercesGroupInfo> groupEnum(groupInfoRegistry, false, fMemoryManager);

            while (groupEnum.hasMoreElements()) {

                XercesGroupInfo& curGroup = groupEnum.nextElement();
                XercesGroupInfo* baseGroup = curGroup.getBaseGroup();

                if (baseGroup) {
                    try {
                        checkParticleDerivationOk(&sGrammar, curGroup.getContentSpec(), curGroup.getScope(),
                                                  baseGroup->getContentSpec(), baseGroup->getScope());
                    }
                    catch (const XMLException& excep) {
                        fSchemaErrorReporter.emitError(excep, curGroup.getLocator());
					}
                }

                if (curGroup.getCheckElementConsistency())
                    checkRefElementConsistency(&sGrammar, 0, &curGroup);
            }
        }
    }
}